

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

string * minja::capitalize(string *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  pointer pcVar2;
  char *pcVar3;
  int iVar4;
  
  sVar1 = s->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (s->_M_dataplus)._M_p;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    iVar4 = toupper((int)*pcVar3);
    *pcVar3 = (char)iVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string capitalize(const std::string & s) {
  if (s.empty()) return s;
  auto result = s;
  result[0] = std::toupper(result[0]);
  return result;
}